

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

Sampler * vk::mapVkSampler(Sampler *__return_storage_ptr__,VkSamplerCreateInfo *samplerCreateInfo)

{
  VkBool32 VVar1;
  WrapMode wrapS_;
  WrapMode wrapT_;
  WrapMode wrapR_;
  FilterMode minFilter_;
  FilterMode magFilter_;
  InternalError *this;
  CompareMode local_c4;
  Vector<float,_4> local_94;
  Vector<unsigned_int,_4> local_84;
  Vector<float,_4> local_74;
  Vector<unsigned_int,_4> local_64;
  Vector<float,_4> local_54;
  Vector<unsigned_int,_4> local_44;
  Vector<float,_4> local_28;
  VkSamplerCreateInfo *local_18;
  VkSamplerCreateInfo *samplerCreateInfo_local;
  
  local_18 = samplerCreateInfo;
  wrapS_ = mapVkSamplerAddressMode(samplerCreateInfo->addressModeU);
  wrapT_ = mapVkSamplerAddressMode(local_18->addressModeV);
  wrapR_ = mapVkSamplerAddressMode(local_18->addressModeW);
  minFilter_ = mapVkMinTexFilter(local_18->minFilter,local_18->mipmapMode);
  magFilter_ = mapVkMagTexFilter(local_18->magFilter);
  VVar1 = local_18->unnormalizedCoordinates;
  if (local_18->compareEnable == 0) {
    local_c4 = COMPAREMODE_NONE;
  }
  else {
    local_c4 = mapVkSamplerCompareOp(local_18->compareOp);
  }
  tcu::Vector<float,_4>::Vector(&local_28,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            (__return_storage_ptr__,wrapS_,wrapT_,wrapR_,minFilter_,magFilter_,0.0,
             (bool)((VVar1 != 0 ^ 0xffU) & 1),local_c4,0,&local_28,true,MODE_DEPTH);
  if (local_18->anisotropyEnable == 0) {
    switch(local_18->borderColor) {
    case VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK:
      tcu::Vector<float,_4>::Vector(&local_94,0.0,0.0,0.0,0.0);
      rr::GenericVec4::operator=(&__return_storage_ptr__->borderColor,&local_94);
      break;
    case VK_BORDER_COLOR_INT_TRANSPARENT_BLACK:
      tcu::Vector<unsigned_int,_4>::Vector(&local_84,0,0,0,0);
      rr::GenericVec4::operator=(&__return_storage_ptr__->borderColor,&local_84);
      break;
    case VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK:
      tcu::Vector<float,_4>::Vector(&local_54,0.0,0.0,0.0,1.0);
      rr::GenericVec4::operator=(&__return_storage_ptr__->borderColor,&local_54);
      break;
    case VK_BORDER_COLOR_INT_OPAQUE_BLACK:
      tcu::Vector<unsigned_int,_4>::Vector(&local_44,0,0,0,1);
      rr::GenericVec4::operator=(&__return_storage_ptr__->borderColor,&local_44);
      break;
    case VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE:
      tcu::Vector<float,_4>::Vector(&local_74,1.0,1.0,1.0,1.0);
      rr::GenericVec4::operator=(&__return_storage_ptr__->borderColor,&local_74);
      break;
    case VK_BORDER_COLOR_INT_OPAQUE_WHITE:
      tcu::Vector<unsigned_int,_4>::Vector(&local_64,1,1,1,1);
      rr::GenericVec4::operator=(&__return_storage_ptr__->borderColor,&local_64);
    }
    return __return_storage_ptr__;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this,"Anisotropic filtering is not supported by tcu::Sampler",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
             ,0x377);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

tcu::Sampler mapVkSampler (const VkSamplerCreateInfo& samplerCreateInfo)
{
	// \note minLod & maxLod are not supported by tcu::Sampler. LOD must be clamped
	//       before passing it to tcu::Texture*::sample*()

	tcu::Sampler sampler(mapVkSamplerAddressMode(samplerCreateInfo.addressModeU),
						 mapVkSamplerAddressMode(samplerCreateInfo.addressModeV),
						 mapVkSamplerAddressMode(samplerCreateInfo.addressModeW),
						 mapVkMinTexFilter(samplerCreateInfo.minFilter, samplerCreateInfo.mipmapMode),
						 mapVkMagTexFilter(samplerCreateInfo.magFilter),
						 0.0f,
						 !samplerCreateInfo.unnormalizedCoordinates,
						 samplerCreateInfo.compareEnable ? mapVkSamplerCompareOp(samplerCreateInfo.compareOp)
														 : tcu::Sampler::COMPAREMODE_NONE,
						 0,
						 tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f),
						 true);

	if (samplerCreateInfo.anisotropyEnable)
		TCU_THROW(InternalError, "Anisotropic filtering is not supported by tcu::Sampler");

	switch (samplerCreateInfo.borderColor)
	{
		case VK_BORDER_COLOR_INT_OPAQUE_BLACK:
			sampler.borderColor = tcu::UVec4(0,0,0,1);
			break;
		case VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK:
			sampler.borderColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
			break;
		case VK_BORDER_COLOR_INT_OPAQUE_WHITE:
			sampler.borderColor = tcu::UVec4(1, 1, 1, 1);
			break;
		case VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE:
			sampler.borderColor = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
			break;
		case VK_BORDER_COLOR_INT_TRANSPARENT_BLACK:
			sampler.borderColor = tcu::UVec4(0,0,0,0);
			break;
		case VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK:
			sampler.borderColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return sampler;
}